

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O2

void __thiscall OpenMD::NPTf::scaleSimBox(NPTf *this)

{
  Mat3x3d *pMVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  Mat3x3d *pMVar5;
  char *__format;
  Mat3x3d *pMVar6;
  long lVar7;
  Mat3x3d *pMVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  uint uVar14;
  Mat3x3d scaleMat;
  Mat3x3d hmat;
  Mat3x3d hmnew;
  Mat3x3d hm;
  SquareMatrix<double,_3> local_180;
  RectMatrix<double,_3U,_3U> local_138;
  RectMatrix<double,_3U,_3U> local_f0;
  SquareMatrix<double,_3> local_a8;
  SquareMatrix<double,_3> local_60;
  
  SquareMatrix<double,_3>::SquareMatrix(&local_180);
  SquareMatrix<double,_3>::SquareMatrix(&local_60);
  SquareMatrix<double,_3>::SquareMatrix(&local_a8);
  pMVar1 = &this->eta;
  dVar2 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt;
  dVar10 = 0.0;
  dVar12 = 1.0;
  dVar11 = 1.0;
  pMVar5 = pMVar1;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pMVar6 = pMVar1;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      dVar13 = 0.0;
      pMVar8 = pMVar6;
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        dVar13 = dVar13 + (pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar9] *
                          (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        pMVar8 = (Mat3x3d *)
                 ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
      }
      uVar14 = 0x3ff00000;
      if (lVar4 != lVar7) {
        uVar14 = 0;
      }
      dVar13 = (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[lVar4]
               [lVar7] * dVar2 + dVar13 * dVar2 * 0.5 * dVar2 + (double)((ulong)uVar14 << 0x20);
      local_180.super_RectMatrix<double,_3U,_3U>.data_[lVar4][lVar7] = dVar13;
      if ((lVar4 != lVar7) && (dVar13 = ABS(dVar13), dVar10 < dVar13)) {
        dVar10 = dVar13;
      }
      pMVar6 = (Mat3x3d *)
               ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               1);
    }
    dVar13 = *(double *)((long)local_180.super_RectMatrix<double,_3U,_3U>.data_ + lVar4 * 0x20);
    dVar3 = dVar13;
    if (dVar13 <= dVar12) {
      dVar3 = dVar12;
    }
    dVar12 = dVar3;
    if (dVar11 <= dVar13) {
      dVar13 = dVar11;
    }
    dVar11 = dVar13;
    pMVar5 = (Mat3x3d *)
             ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  }
  if ((1.01 < dVar12) || (dVar11 < 0.99)) {
    __format = 
    "NPTf error: Attempting a Box scaling of more than 1 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n      eta = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
    ;
  }
  else {
    if (dVar10 <= 0.01) {
      Snapshot::getHmat((Mat3x3d *)&local_f0,
                        (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
      operator*((SquareMatrix3<double> *)&local_138,(SquareMatrix3<double> *)&local_f0,
                (SquareMatrix3<double> *)&local_180);
      RectMatrix<double,_3U,_3U>::operator=(&local_f0,&local_138);
      Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                        (Mat3x3d *)&local_f0);
      return;
    }
    __format = 
    "NPTf error: Attempting an off-diagonal Box scaling of more than 1 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n      eta = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
    ;
  }
  snprintf(painCave.errMsg,2000,__format,local_180.super_RectMatrix<double,_3U,_3U>.data_[0][0],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[0][1],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[0][2],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[1][0],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[1][1],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[1][2],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[2][0],
           local_180.super_RectMatrix<double,_3U,_3U>.data_[2][1]);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void NPTf::scaleSimBox() {
    int i;
    int j;
    int k;
    Mat3x3d scaleMat;
    RealType eta2ij;
    RealType bigScale, smallScale, offDiagMax;
    Mat3x3d hm;
    Mat3x3d hmnew;

    // Scale the box after all the positions have been moved:

    // Use a taylor expansion for eta products:  Hmat = Hmat . exp(dt * etaMat)
    //  Hmat = Hmat . ( Ident + dt * etaMat  + dt^2 * etaMat*etaMat / 2)

    bigScale   = 1.0;
    smallScale = 1.0;
    offDiagMax = 0.0;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        // Calculate the matrix Product of the eta array (we only need
        // the ij element right now):

        eta2ij = 0.0;
        for (k = 0; k < 3; k++) {
          eta2ij += eta(i, k) * eta(k, j);
        }

        scaleMat(i, j) = 0.0;
        // identity matrix (see above):
        if (i == j) scaleMat(i, j) = 1.0;
        // Taylor expansion for the exponential truncated at second order:
        scaleMat(i, j) += dt * eta(i, j) + 0.5 * dt * dt * eta2ij;

        if (i != j)
          if (fabs(scaleMat(i, j)) > offDiagMax)
            offDiagMax = fabs(scaleMat(i, j));
      }

      if (scaleMat(i, i) > bigScale) bigScale = scaleMat(i, i);
      if (scaleMat(i, i) < smallScale) smallScale = scaleMat(i, i);
    }

    if ((bigScale > 1.01) || (smallScale < 0.99)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPTf error: Attempting a Box scaling of more than 1 percent.\n"
               " Check your tauBarostat, as it is probably too small!\n\n"
               " scaleMat = [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "      eta = [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n",
               scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
               scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
               scaleMat(2, 2), eta(0, 0), eta(0, 1), eta(0, 2), eta(1, 0),
               eta(1, 1), eta(1, 2), eta(2, 0), eta(2, 1), eta(2, 2));
      painCave.isFatal = 1;
      simError();
    } else if (offDiagMax > 0.01) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "NPTf error: Attempting an off-diagonal Box scaling of more than 1 "
          "percent.\n"
          " Check your tauBarostat, as it is probably too small!\n\n"
          " scaleMat = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "      eta = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n",
          scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
          scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
          scaleMat(2, 2), eta(0, 0), eta(0, 1), eta(0, 2), eta(1, 0), eta(1, 1),
          eta(1, 2), eta(2, 0), eta(2, 1), eta(2, 2));
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat         = hmat * scaleMat;
      snap->setHmat(hmat);
    }
  }